

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSProfileInfo::AddRun(ACSProfileInfo *this,uint num_instr)

{
  this->TotalInstr = this->TotalInstr + (ulong)num_instr;
  this->NumRuns = this->NumRuns + 1;
  if (num_instr < this->MinInstrPerRun) {
    this->MinInstrPerRun = num_instr;
  }
  if (this->MaxInstrPerRun < num_instr) {
    this->MaxInstrPerRun = num_instr;
  }
  return;
}

Assistant:

void ACSProfileInfo::AddRun(unsigned int num_instr)
{
	TotalInstr += num_instr;
	NumRuns++;
	if (num_instr < MinInstrPerRun)
	{
		MinInstrPerRun = num_instr;
	}
	if (num_instr > MaxInstrPerRun)
	{
		MaxInstrPerRun = num_instr;
	}
}